

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainLoop.h
# Opt level: O2

int __thiscall MainLoop::Run(MainLoop *this)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)this;
  if (__MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    Init();
    this_00 = &local_10;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  }
  p_Begin((MainLoop *)this_00);
  while( true ) {
    bVar1 = p_CheckRunCondition((MainLoop *)this_00);
    if (!bVar1) break;
    this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)this;
    p_Update(this);
    p_Render((MainLoop *)this_00);
  }
  p_Teardown((MainLoop *)this_00);
  return 0;
}

Assistant:

int MainLoop::Run()
{
	if (__MainLoop__ == NULL)
		MainLoop::Init();
	p_Begin();
	while (p_CheckRunCondition())
	{
		p_Update();
		p_Render();
	}
	p_Teardown();
	return 0;
}